

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O0

void __thiscall pmx::PmxBone::Read(PmxBone *this,istream *stream,PmxSetting *setting)

{
  int iVar1;
  type this_00;
  int local_6c;
  int i;
  pmx local_60 [32];
  pmx local_40 [32];
  PmxSetting *local_20;
  PmxSetting *setting_local;
  istream *stream_local;
  PmxBone *this_local;
  
  local_20 = setting;
  setting_local = (PmxSetting *)stream;
  stream_local = (istream *)this;
  ReadString_abi_cxx11_(local_40,stream,setting->encoding);
  std::__cxx11::string::operator=((string *)this,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  ReadString_abi_cxx11_(local_60,(istream *)setting_local,local_20->encoding);
  std::__cxx11::string::operator=((string *)&this->bone_english_name,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::istream::read((char *)setting_local,(long)this->position);
  iVar1 = ReadIndex((istream *)setting_local,(uint)local_20->bone_index_size);
  this->parent_index = iVar1;
  std::istream::read((char *)setting_local,(long)&this->level);
  std::istream::read((char *)setting_local,(long)&this->bone_flag);
  if ((this->bone_flag & 1) == 0) {
    std::istream::read((char *)setting_local,(long)this->offset);
  }
  else {
    iVar1 = ReadIndex((istream *)setting_local,(uint)local_20->bone_index_size);
    this->target_index = iVar1;
  }
  if ((this->bone_flag & 0x300) != 0) {
    iVar1 = ReadIndex((istream *)setting_local,(uint)local_20->bone_index_size);
    this->grant_parent_index = iVar1;
    std::istream::read((char *)setting_local,(long)&this->grant_weight);
  }
  if ((this->bone_flag & 0x400) != 0) {
    std::istream::read((char *)setting_local,(long)this->lock_axis_orientation);
  }
  if ((this->bone_flag & 0x800) != 0) {
    std::istream::read((char *)setting_local,(long)this->local_axis_x_orientation);
    std::istream::read((char *)setting_local,(long)this->local_axis_y_orientation);
  }
  if ((this->bone_flag & 0x2000) != 0) {
    std::istream::read((char *)setting_local,(long)&this->key);
  }
  if ((this->bone_flag & 0x20) != 0) {
    iVar1 = ReadIndex((istream *)setting_local,(uint)local_20->bone_index_size);
    this->ik_target_bone_index = iVar1;
    std::istream::read((char *)setting_local,(long)&this->ik_loop);
    std::istream::read((char *)setting_local,(long)&this->ik_loop_angle_limit);
    std::istream::read((char *)setting_local,(long)&this->ik_link_count);
    std::make_unique<pmx::PmxIkLink[]>((size_t)&stack0xffffffffffffff98);
    std::unique_ptr<pmx::PmxIkLink[],_std::default_delete<pmx::PmxIkLink[]>_>::operator=
              (&this->ik_links,
               (unique_ptr<pmx::PmxIkLink[],_std::default_delete<pmx::PmxIkLink[]>_> *)
               &stack0xffffffffffffff98);
    std::unique_ptr<pmx::PmxIkLink[],_std::default_delete<pmx::PmxIkLink[]>_>::~unique_ptr
              ((unique_ptr<pmx::PmxIkLink[],_std::default_delete<pmx::PmxIkLink[]>_> *)
               &stack0xffffffffffffff98);
    for (local_6c = 0; local_6c < this->ik_link_count; local_6c = local_6c + 1) {
      this_00 = std::unique_ptr<pmx::PmxIkLink[],_std::default_delete<pmx::PmxIkLink[]>_>::
                operator[](&this->ik_links,(long)local_6c);
      PmxIkLink::Read(this_00,(istream *)setting_local,local_20);
    }
  }
  return;
}

Assistant:

void PmxBone::Read(std::istream *stream, PmxSetting *setting)
	{
		this->bone_name = std::move(ReadString(stream, setting->encoding));
		this->bone_english_name = std::move(ReadString(stream, setting->encoding));
		stream->read((char*) this->position, sizeof(float) * 3);
		this->parent_index = ReadIndex(stream, setting->bone_index_size);
		stream->read((char*) &this->level, sizeof(int));
		stream->read((char*) &this->bone_flag, sizeof(uint16_t));
		if (this->bone_flag & 0x0001) {
			this->target_index = ReadIndex(stream, setting->bone_index_size);
		}
		else {
			stream->read((char*)this->offset, sizeof(float) * 3);
		}
		if (this->bone_flag & (0x0100 | 0x0200)) {
			this->grant_parent_index = ReadIndex(stream, setting->bone_index_size);
			stream->read((char*) &this->grant_weight, sizeof(float));
		}
		if (this->bone_flag & 0x0400) {
			stream->read((char*)this->lock_axis_orientation, sizeof(float) * 3);
		}
		if (this->bone_flag & 0x0800) {
			stream->read((char*)this->local_axis_x_orientation, sizeof(float) * 3);
			stream->read((char*)this->local_axis_y_orientation, sizeof(float) * 3);
		}
		if (this->bone_flag & 0x2000) {
			stream->read((char*) &this->key, sizeof(int));
		}
		if (this->bone_flag & 0x0020) {
			this->ik_target_bone_index = ReadIndex(stream, setting->bone_index_size);
			stream->read((char*) &ik_loop, sizeof(int));
			stream->read((char*) &ik_loop_angle_limit, sizeof(float));
			stream->read((char*) &ik_link_count, sizeof(int));
			this->ik_links = std::make_unique<PmxIkLink []>(ik_link_count);
			for (int i = 0; i < ik_link_count; i++) {
				ik_links[i].Read(stream, setting);
			}
		}
	}